

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O3

Vec_Int_t * Fra_ClauSaveOutputVars(Aig_Man_t *pMan,Cnf_Dat_t *pCnf)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = pMan->nObjs[3];
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar2;
  pVVar3 = pMan->vCos;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      Vec_IntPush(p,pCnf->pVarNums[*(int *)((long)pVVar3->pArray[lVar5] + 0x24)]);
      lVar5 = lVar5 + 1;
      pVVar3 = pMan->vCos;
    } while (lVar5 < pVVar3->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_ClauSaveOutputVars( Aig_Man_t * pMan, Cnf_Dat_t * pCnf )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj;
    int i;
    vVars = Vec_IntAlloc( Aig_ManCoNum(pMan) );
    Aig_ManForEachCo( pMan, pObj, i )
        Vec_IntPush( vVars, pCnf->pVarNums[pObj->Id] );
    return vVars;
}